

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_grow.cpp
# Opt level: O2

int rg::get_important_obstacles
              (RGProblem *problem,RGRegion *region,
              vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
              *obstacles)

{
  int iVar1;
  Vector3i *pVVar2;
  int *piVar3;
  bool bVar4;
  uint uVar5;
  undefined7 extraout_var;
  int *src;
  Vector3i *dst;
  Vector3i *upper_vertex;
  pointer pRVar7;
  Vector3i local_28;
  Vector3i local_1c;
  ulong uVar6;
  
  local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       -10000;
  local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       10000;
  local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       10000;
  local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       -10000;
  local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       10000;
  local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       -10000;
  for (pRVar7 = (region->region_bound_pts).
                super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar7 != (region->region_bound_pts).
                super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
                super__Vector_impl_data._M_finish; pRVar7 = pRVar7 + 1) {
    iVar1 = (pRVar7->point).super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0];
    if (local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
        < iVar1) {
      local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           iVar1;
    }
    if (iVar1 < local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[0]) {
      local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           iVar1;
    }
    iVar1 = (pRVar7->point).super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    if (local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
        < iVar1) {
      local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           iVar1;
    }
    if (iVar1 < local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1]) {
      local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           iVar1;
    }
    iVar1 = (pRVar7->point).super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[2];
    if (local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
        < iVar1) {
      local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           iVar1;
    }
    if (iVar1 < local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[2]) {
      local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           iVar1;
    }
  }
  upper_vertex = &local_1c;
  uVar5 = RGProblem::getInnerObstacles(problem,upper_vertex,&local_28,obstacles);
  uVar6 = (ulong)uVar5;
  piVar3 = *(int **)(upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).
                    m_storage.m_data.array;
  do {
    src = piVar3;
    pVVar2 = *(Vector3i **)
              ((upper_vertex->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array + 2);
    if ((Vector3i *)src == pVVar2) break;
    bVar4 = RGProblem::isObstacleOnPath(problem,(Vector3i *)src,dst,obstacles);
    uVar6 = CONCAT71(extraout_var,bVar4);
    piVar3 = src + 4;
  } while (!bVar4);
  return (int)CONCAT71((int7)(uVar6 >> 8),(Vector3i *)src == pVVar2);
}

Assistant:

int get_important_obstacles(const RGProblem &problem, const RGRegion &region, std::vector<Eigen::Vector3i> *obstacles)
{
  int max_x = -10000;
  int min_x = 10000; 
  int max_y = -10000;
  int min_y = 10000; 
  int max_z = -10000;
  int min_z = 10000;
  for (auto it = region.region_bound_pts.cbegin(); it != region.region_bound_pts.cend(); ++it)
  {
    if (it->point.x() > max_x)
      max_x = it->point.x();
    if (it->point.x() < min_x)
      min_x = it->point.x();
    if (it->point.y() > max_y)
      max_y = it->point.y();
    if (it->point.y() < min_y)
      min_y = it->point.y();
    if (it->point.z() > max_z)
      max_z = it->point.z();
    if (it->point.z() < min_z)
      min_z = it->point.z();
  }

  problem.getInnerObstacles(Eigen::Vector3i(max_x, max_y, max_z), Eigen::Vector3i(min_x, min_y, min_z), obstacles);

  return OK;
}